

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

HelicsBool helicsInputGetBoolean(HelicsInput inp,HelicsError *err)

{
  bool bVar1;
  InputObject *pIVar2;
  uint uVar3;
  
  pIVar2 = anon_unknown.dwarf_694c0::verifyInput(inp,err);
  uVar3 = 0;
  if (pIVar2 != (InputObject *)0x0) {
    bVar1 = helics::Input::getValue_impl<bool>(pIVar2->inputPtr);
    uVar3 = (uint)bVar1;
  }
  return uVar3;
}

Assistant:

HelicsBool helicsInputGetBoolean(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        const bool boolval = inpObj->inputPtr->getValue<bool>();
        return (boolval) ? HELICS_TRUE : HELICS_FALSE;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}